

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void cm_print_error(char *format,...)

{
  long lVar1;
  char in_AL;
  char *in_RDX;
  __va_list_tag *in_RSI;
  __va_list_tag *in_R9;
  long in_FS_OFFSET;
  char *in_XMM0_Qa;
  va_list args;
  char *in_stack_ffffffffffffff48;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff48 = in_XMM0_Qa;
  }
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (cm_error_message_enabled == 0) {
    vprint_error(in_RDX,in_RSI);
  }
  else {
    vcm_print_error(in_stack_ffffffffffffff48,in_R9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void cm_print_error(const char * const format, ...)
{
    va_list args;
    va_start(args, format);
    if (cm_error_message_enabled) {
        vcm_print_error(format, args);
    } else {
        vprint_error(format, args);
    }
    va_end(args);
}